

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O2

value_t max<float_const*>(float *values,int from,int to)

{
  float fVar1;
  long lVar2;
  int index;
  value_t vVar3;
  
  vVar3 = 0.0;
  for (lVar2 = (long)from; lVar2 <= to; lVar2 = lVar2 + 1) {
    fVar1 = values[lVar2];
    if ((lVar2 != 0) && (fVar1 <= vVar3)) {
      fVar1 = vVar3;
    }
    vVar3 = fVar1;
  }
  return vVar3;
}

Assistant:

inline value_t max(T values, int from, int to) {
	value_t max = 0;
	for (int index = from; index <= to; index++) {
		value_t next_value = values[index];
		max = index == 0 || next_value > max ? next_value : max;
	}

	return max;
}